

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void duckdb::StringMinMaxBase::Combine<duckdb::MinMaxStringState,duckdb::MinOperationString>
               (MinMaxStringState *source,MinMaxStringState *target,AggregateInputData *input_data)

{
  if ((source->super_MinMaxState<duckdb::string_t>).isset == true) {
    if ((target->super_MinMaxState<duckdb::string_t>).isset != false) {
      MinOperationString::Execute<duckdb::string_t,duckdb::MinMaxStringState>
                (target,(string_t)(source->super_MinMaxState<duckdb::string_t>).value.value.pointer,
                 input_data);
      return;
    }
    MinMaxStringState::Assign
              (target,(string_t)(source->super_MinMaxState<duckdb::string_t>).value.value.pointer);
    (target->super_MinMaxState<duckdb::string_t>).isset = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			Assign(target, source.value, input_data);
			target.isset = true;
		} else {
			OP::template Execute<string_t, STATE>(target, source.value, input_data);
		}
	}